

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

bool __thiscall
Am_Object_Data::notify_unique(Am_Object_Data *this,Am_Slot_Key key,Am_Wrapper *new_value)

{
  long lVar1;
  bool bVar2;
  Am_Slot_Data *slot;
  Am_Slot_Data **slot_array;
  uint i;
  Am_Wrapper *new_value_local;
  Am_Slot_Key key_local;
  Am_Object_Data *this_local;
  
  slot_array._4_4_ = (this->data).length;
  slot = (Am_Slot_Data *)(this->data).data;
  while( true ) {
    if (slot_array._4_4_ == 0) {
      propagate_unique(this,key,new_value);
      return false;
    }
    lVar1 = *(long *)&slot->super_Am_Value;
    if (key == *(Am_Slot_Key *)(lVar1 + 0x30)) break;
    slot_array._4_4_ = slot_array._4_4_ - 1;
    slot = (Am_Slot_Data *)&(slot->super_Am_Value).value;
  }
  if ((*(ushort *)(lVar1 + 0x38) & 2) != 0) {
    if (new_value != (Am_Wrapper *)0x0) {
      Am_Wrapper::Note_Reference(new_value);
    }
    *(Am_Wrapper **)(lVar1 + 8) = new_value;
    if (((*(ushort *)(lVar1 + 0x38) & 1) != 0) &&
       (bVar2 = propagate_unique(this,key,new_value), bVar2)) {
      *(ushort *)(lVar1 + 0x38) =
           *(ushort *)(lVar1 + 0x38) & 0xff00 | *(ushort *)(lVar1 + 0x38) & 0xfe;
    }
    return false;
  }
  return true;
}

Assistant:

bool
Am_Object_Data::notify_unique(Am_Slot_Key key, Am_Wrapper *new_value)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data.length, slot_array = (Am_Slot_Data **)data.data; i > 0;
       --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        if (new_value)
          new_value->Note_Reference();
        slot->value.wrapper_value = new_value;
        if (slot->flags & BIT_IS_INHERITED)
          if (propagate_unique(key, new_value))
            slot->flags &= ~BIT_IS_INHERITED;
        return false;
      } else
        return true;
    }
  }
  propagate_unique(key, new_value);
  return false;
}